

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

void __thiscall
MODEL3D::three_dim_model::generate_freecad_solid
          (three_dim_model *this,Paths *primary,Paths *secondary,bool *has_holes,int *layer_number,
          int *mask_type)

{
  double *overlap_factor;
  pointer pvVar1;
  _Alloc_hider _Var2;
  map<int,_std::vector<GEO::point,_std::allocator<GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>_>
  *pmVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar6;
  pointer pvVar7;
  Paths adjusted_paths;
  bool bot_strt;
  double o_f;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  three_dim_model *local_200;
  string local_1f8;
  string local_1d8;
  pointer local_1b8;
  string local_1b0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_190;
  map<int,_std::vector<GEO::point,_std::allocator<GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>_>
  *local_188;
  Paths *local_180;
  map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
  *local_178;
  string local_170;
  string local_150;
  ClipperOffset local_130;
  
  local_200 = this;
  local_1b8 = (pointer)mask_type;
  std::__cxx11::to_string(&local_268,*layer_number);
  std::operator+(&local_240,"    additive_ingredients_",&local_268);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                 &local_240," = []");
  local_190 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &local_200->py_script;
  local_188 = (map<int,_std::vector<GEO::point,_std::allocator<GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>_>
               *)secondary;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_190,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_268);
  pvVar1 = (primary->
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_180 = primary;
  for (pvVar7 = (primary->
                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar7 != pvVar1; pvVar7 = pvVar7 + 1) {
    local_240._M_dataplus._M_p._0_1_ = 0;
    local_130.MiterLimit = local_200->additive_overlap_factor;
    if (*(int *)local_1b8 == 3) {
      local_130.MiterLimit = 1.0;
    }
    else if (*(int *)local_1b8 == 1) {
      local_240._M_dataplus._M_p._0_1_ = 1;
    }
    local_268._M_dataplus._M_p._0_1_ = 1;
    push_freecad_pss(local_200,pvVar7,(bool *)&local_240,layer_number,(bool *)&local_268,
                     &local_130.MiterLimit);
  }
  local_130.MiterLimit = (double)CONCAT71(local_130.MiterLimit._1_7_,1);
  build_additive_shapes(local_200,layer_number,(bool *)&local_130);
  std::__cxx11::to_string(&local_1f8,*layer_number);
  std::operator+(&local_220,"    additive_fuse_",&local_1f8);
  std::operator+(&local_268,&local_220,"= additives_");
  pmVar3 = local_188;
  pvVar6 = local_190;
  std::__cxx11::to_string(&local_1d8,*layer_number);
  std::operator+(&local_240,&local_268,&local_1d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                 &local_240,"[0]");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130)
  ;
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::to_string(&local_1b0,*layer_number);
  std::operator+(&local_1d8,"    additive_fuse_",&local_1b0);
  std::operator+(&local_1f8,&local_1d8," = additive_fuse_");
  std::__cxx11::to_string(&local_150,*layer_number);
  std::operator+(&local_220,&local_1f8,&local_150);
  std::operator+(&local_268,&local_220,".fuse(additives_");
  std::__cxx11::to_string(&local_170,*layer_number);
  std::operator+(&local_240,&local_268,&local_170);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                 &local_240,")");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130)
  ;
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b0);
  if ((((_Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
         *)&pmVar3->_M_t)->_M_impl).super__Vector_impl_data._M_finish ==
      (((_Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
         *)&pmVar3->_M_t)->_M_impl).super__Vector_impl_data._M_start) {
    std::__cxx11::to_string(&local_220,*layer_number);
    std::operator+(&local_268,"    layer_",&local_220);
    std::operator+(&local_240,&local_268,"=additive_fuse_");
    std::__cxx11::to_string(&local_1f8,*layer_number);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_240,&local_1f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_130);
  }
  else {
    std::__cxx11::to_string(&local_268,*layer_number);
    std::operator+(&local_240,"    subtractive_ingredients_",&local_268);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_240," = []");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_268);
    pvVar1 = (((_Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                *)&pmVar3->_M_t)->_M_impl).super__Vector_impl_data._M_finish;
    overlap_factor = &local_200->subtractive_overlap_factor;
    for (pvVar7 = (((_Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                     *)&pmVar3->_M_t)->_M_impl).super__Vector_impl_data._M_start; pvVar7 != pvVar1;
        pvVar7 = pvVar7 + 1) {
      local_130.MiterLimit = (double)CONCAT71(local_130.MiterLimit._1_7_,*(int *)local_1b8 != 1);
      local_240._M_dataplus._M_p._0_1_ = 0;
      push_freecad_pss(local_200,pvVar7,(bool *)&local_130,layer_number,(bool *)&local_240,
                       overlap_factor);
    }
    build_subtractive_shapes(local_200,layer_number);
    std::__cxx11::to_string(&local_1b0,*layer_number);
    std::operator+(&local_1d8,"    subtractive_cut_",&local_1b0);
    std::operator+(&local_1f8,&local_1d8,"= additive_fuse_");
    pvVar6 = local_190;
    std::__cxx11::to_string(&local_150,*layer_number);
    std::operator+(&local_220,&local_1f8,&local_150);
    std::operator+(&local_268,&local_220,".cut(subtractives_");
    std::__cxx11::to_string(&local_170,*layer_number);
    std::operator+(&local_240,&local_268,&local_170);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_240,")");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::to_string(&local_220,*layer_number);
    std::operator+(&local_268,"layer_",&local_220);
    std::operator+(&local_240,&local_268," = subtractive_cut_");
    std::__cxx11::to_string(&local_1f8,*layer_number);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_240,&local_1f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_130);
  }
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::to_string(&local_1f8,*layer_number);
  std::operator+(&local_220,"    lyr_",&local_1f8);
  std::operator+(&local_268,&local_220," = My_doc.addObject(\"Part::Feature\",\"layer_");
  std::__cxx11::to_string(&local_1d8,*layer_number);
  std::operator+(&local_240,&local_268,&local_1d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                 &local_240,"\")");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130)
  ;
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::to_string(&local_220,*layer_number);
  std::operator+(&local_268,"    lyr_",&local_220);
  std::operator+(&local_240,&local_268,".Shape = layer_");
  std::__cxx11::to_string(&local_1f8,*layer_number);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                 &local_240,&local_1f8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130)
  ;
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_220);
  if (*(int *)local_1b8 == 3) {
    std::__cxx11::to_string((string *)&local_130,*layer_number);
    std::operator+(&local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   "_Al");
    std::__cxx11::string::~string((string *)&local_130);
    std::operator+(&local_268,"    additive_ingredients_",&local_240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_268," = []");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_268);
    local_1b8 = (local_180->
                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    local_188 = &local_200->etch_contour_map;
    local_178 = &local_200->proc_info_map;
    for (pvVar7 = (local_180->
                  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pvVar7 != local_1b8;
        pvVar7 = pvVar7 + 1) {
      local_268._M_dataplus._M_p = (pointer)0x0;
      local_268._M_string_length = 0;
      local_268.field_2._M_allocated_capacity = 0;
      ClipperLib::ClipperOffset::ClipperOffset(&local_130,2.0,0.25);
      ClipperLib::ClipperOffset::Clear(&local_130);
      ClipperLib::ClipperOffset::AddPath(&local_130,pvVar7,jtSquare,etClosedPolygon);
      pmVar4 = std::
               map<int,_std::vector<GEO::point,_std::allocator<GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>_>
               ::operator[](local_188,layer_number);
      ClipperLib::ClipperOffset::Execute
                (&local_130,(Paths *)&local_268,
                 (pmVar4->super__Vector_base<GEO::point,_std::allocator<GEO::point>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1].x);
      _Var2._M_p = local_268._M_dataplus._M_p;
      local_1d8._M_dataplus._M_p._0_1_ = 1;
      pmVar5 = std::
               map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
               ::operator[](local_178,layer_number);
      local_220._M_dataplus._M_p._0_4_ = pmVar5->z_start + -9;
      local_1f8._M_dataplus._M_p._0_4_ = 8;
      push_freecad_prism(local_200,(Path *)_Var2._M_p,(bool *)&local_1d8,(int *)&local_220,
                         (int *)&local_1f8,&local_240);
      ClipperLib::ClipperOffset::~ClipperOffset(&local_130);
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 *)&local_268);
    }
    build_additive_sub_layer(local_200,&local_240);
    std::__cxx11::to_string(&local_170,*layer_number);
    pvVar6 = local_190;
    std::operator+(&local_150,"    layer_",&local_170);
    std::operator+(&local_1b0,&local_150,"_Al = ");
    std::operator+(&local_1d8,&local_1b0,"additives_");
    std::operator+(&local_1f8,&local_1d8,&local_240);
    std::operator+(&local_220,&local_1f8,"[0].fuse(additives_");
    std::operator+(&local_268,&local_220,&local_240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_268,")");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::to_string(&local_1d8,*layer_number);
    std::operator+(&local_1f8,"    lyr_",&local_1d8);
    std::operator+(&local_220,&local_1f8,"_Al = My_doc.addObject(\"Part::Feature\",\"layer_");
    std::__cxx11::to_string(&local_1b0,*layer_number);
    std::operator+(&local_268,&local_220,&local_1b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_268,"_Al\")");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::to_string(&local_1d8,*layer_number);
    std::operator+(&local_1f8,"    lyr_",&local_1d8);
    std::operator+(&local_220,&local_1f8,"_Al.Shape = layer_");
    std::__cxx11::to_string(&local_1b0,*layer_number);
    std::operator+(&local_268,&local_220,&local_1b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_268,"_Al");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::to_string(&local_268,*layer_number);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_268,"_AlOx");
    std::__cxx11::string::operator=((string *)&local_240,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_268);
    std::operator+(&local_268,"    additive_ingredients_",&local_240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_268," = []");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_268);
    for (pvVar7 = (local_180->
                  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pvVar7 != local_1b8;
        pvVar7 = pvVar7 + 1) {
      local_268._M_dataplus._M_p = (pointer)0x0;
      local_268._M_string_length = 0;
      local_268.field_2._M_allocated_capacity = 0;
      ClipperLib::ClipperOffset::ClipperOffset(&local_130,2.0,0.25);
      ClipperLib::ClipperOffset::Clear(&local_130);
      ClipperLib::ClipperOffset::AddPath(&local_130,pvVar7,jtSquare,etClosedPolygon);
      pmVar4 = std::
               map<int,_std::vector<GEO::point,_std::allocator<GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>_>
               ::operator[](local_188,layer_number);
      ClipperLib::ClipperOffset::Execute
                (&local_130,(Paths *)&local_268,
                 (pmVar4->super__Vector_base<GEO::point,_std::allocator<GEO::point>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1].x);
      _Var2._M_p = local_268._M_dataplus._M_p;
      local_1d8._M_dataplus._M_p._0_1_ = 1;
      pmVar5 = std::
               map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
               ::operator[](local_178,layer_number);
      local_220._M_dataplus._M_p._0_4_ = pmVar5->z_start + -1;
      local_1f8._M_dataplus._M_p._0_4_ = 1;
      push_freecad_prism(local_200,(Path *)_Var2._M_p,(bool *)&local_1d8,(int *)&local_220,
                         (int *)&local_1f8,&local_240);
      ClipperLib::ClipperOffset::~ClipperOffset(&local_130);
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 *)&local_268);
    }
    build_additive_sub_layer(local_200,&local_240);
    std::operator+(&local_1b0,"    layer_",&local_240);
    pvVar6 = local_190;
    std::operator+(&local_1d8,&local_1b0," = additives_");
    std::operator+(&local_1f8,&local_1d8,&local_240);
    std::operator+(&local_220,&local_1f8,"[0].fuse(additives_");
    std::operator+(&local_268,&local_220,&local_240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_268,")");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::operator+(&local_1f8,"    lyr_",&local_240);
    std::operator+(&local_220,&local_1f8," = My_doc.addObject(\"Part::Feature\",\"layer_");
    std::operator+(&local_268,&local_220,&local_240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_268,"\")");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::operator+(&local_220,"    lyr_",&local_240);
    std::operator+(&local_268,&local_220,".Shape = layer_");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_268,&local_240);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (pvVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
  }
  return;
}

Assistant:

void MODEL3D::three_dim_model::generate_freecad_solid(
const ClipperLib::Paths &primary,
const ClipperLib::Paths &secondary,
const bool &has_holes,
const int &layer_number,
const int &mask_type)
{
  // Create the list of additive shapes
    py_script.push_back("    additive_ingredients_"+std::to_string(layer_number)+" = []");
    auto primary_end = primary.end();
    for (auto primary_it = primary.begin();
         primary_it != primary_end;
         primary_it++)
    {
        bool bot_strt = false;//type 0 and 3
        double o_f = additive_overlap_factor;
        if(mask_type==1)// 0 = Standard /^##^\ , 1 = Inverted \_##_/
            bot_strt = true;
        // // Don't overlap on the counter-electrode layer or layer 55 because
        // // layers with circular shapes bug out in the fuse operation of
        // // create_pss. TODO: Still looking for a solution to this.
        // // Layer 51 and 55 have circular shapes
        if((mask_type==3)/*||(layer_number==55)*/)
            o_f = 1;
        push_freecad_pss(*primary_it, bot_strt, layer_number, true, o_f);
    }
    // Build them in python as a list
    build_additive_shapes(layer_number, true);
    // Execute the boolean fuse
    py_script.push_back("    additive_fuse_"    //taking first element of the list
    +std::to_string(layer_number)
    +"= additives_"+std::to_string(layer_number)
    +"[0]");
    py_script.push_back("    additive_fuse_"
    +std::to_string(layer_number)
    +" = additive_fuse_"
    +std::to_string(layer_number)
    +".fuse(additives_"+std::to_string(layer_number)+")");
    // Create a list of subtractive shapes if they exist
    if(secondary.size()>0)
    {
        py_script.push_back("    subtractive_ingredients_"+std::to_string(layer_number)+" = []");
        auto secondary_end = secondary.end();
        for (auto secondary_it = secondary.begin();
            secondary_it != secondary_end;
            secondary_it++)
        {
            bool bot_strt = true;// swapped around from above because placing back
            if(mask_type==1)// 0 = Standard /^##^\ , 1 = Inverted \_##_/
                bot_strt = false;
            push_freecad_pss(*secondary_it, bot_strt, layer_number, false, subtractive_overlap_factor);
        }
        // Build subtractive shapes in python as a list
        build_subtractive_shapes(layer_number);
        // Execute the boolean cut and name it layer
        py_script.push_back("    subtractive_cut_"
        +std::to_string(layer_number)
        +"= additive_fuse_"
        +std::to_string(layer_number)
        +".cut(subtractives_"
        +std::to_string(layer_number)+")");
        py_script.push_back("layer_"
        +std::to_string(layer_number)
        +" = subtractive_cut_"
        + std::to_string(layer_number));
    }
    else// Otherwise name the layer boolean fuse
    {
        py_script.push_back("    layer_"
        +std::to_string(layer_number)
        +"=additive_fuse_"
        +std::to_string(layer_number));
    }
    // py_script.push_back("    Part.show(layer_"
    // +std::to_string(layer_number)+")");
    py_script.push_back("    lyr_"
    +std::to_string(layer_number)+" = My_doc.addObject(\"Part::Feature\",\"layer_"
    +std::to_string(layer_number)+"\")");
    py_script.push_back("    lyr_"+std::to_string(layer_number)
    +".Shape = layer_"+std::to_string(layer_number));
    // Extra work for junction layer case
    if(mask_type==3)
    {
        // Create list of all Al shapes.
        std::string sub_layer = std::to_string(layer_number)+"_Al";
        py_script.push_back("    additive_ingredients_"+sub_layer+" = []");
        auto primary_end = primary.end();
        for (auto primary_it = primary.begin();
            primary_it != primary_end;
            primary_it++)
        {
            //offset the path in question by the contour-width to make flush with counter-electrode
            ClipperLib::Paths adjusted_paths;
            ClipperLib::ClipperOffset co;
            co.Clear();
            co.AddPath(*primary_it, ClipperLib::jtSquare, ClipperLib::etClosedPolygon);
            double offset_value = std::prev(etch_contour_map[layer_number].end(),1)->x;
            co.Execute(adjusted_paths, offset_value);
            push_freecad_prism( adjusted_paths[0],
                                true,
                                (proc_info_map[layer_number].z_start-9), 8, sub_layer);
        }
        // Generate all Al shapes
        build_additive_sub_layer(sub_layer);
        // Merge all AL shapes into sub-layer
        py_script.push_back("    layer_"+std::to_string(layer_number)+"_Al = "+
        "additives_"+sub_layer+"[0].fuse(additives_"+sub_layer+")");
        // py_script.push_back("    Part.show(Layer_"+std::to_string(layer_number)+"_Al)");
        py_script.push_back("    lyr_"
        +std::to_string(layer_number)+"_Al = My_doc.addObject(\"Part::Feature\",\"layer_"
        +std::to_string(layer_number)+"_Al\")");
        py_script.push_back("    lyr_"+std::to_string(layer_number)
        +"_Al.Shape = layer_"+std::to_string(layer_number)+"_Al");
        // Create list of all AlOX shapes
        sub_layer = std::to_string(layer_number)+"_AlOx";
        py_script.push_back("    additive_ingredients_"+sub_layer+" = []");
        for (auto primary_it = primary.begin();
            primary_it != primary_end;
            primary_it++)
        {
            ClipperLib::Paths adjusted_paths;
            ClipperLib::ClipperOffset co;
            co.Clear();
            co.AddPath(*primary_it, ClipperLib::jtSquare, ClipperLib::etClosedPolygon);
            double offset_value = std::prev(etch_contour_map[layer_number].end(),1)->x;
            co.Execute(adjusted_paths, offset_value);
            push_freecad_prism( adjusted_paths[0],
                                true,
                                (proc_info_map[layer_number].z_start-1), 1, sub_layer);
        }
        // Generate all AlOx shapes
        build_additive_sub_layer(sub_layer);
        // Merge AlOx shapes into sub-layer
        py_script.push_back("    layer_"+sub_layer+" = additives_"
        +sub_layer+"[0].fuse(additives_"+sub_layer+")");
        //py_script.push_back("    Part.show(Layer_" + sub_layer + ")");
        py_script.push_back("    lyr_"
        +sub_layer+" = My_doc.addObject(\"Part::Feature\",\"layer_"
        +sub_layer+"\")");
        py_script.push_back("    lyr_"+sub_layer
        +".Shape = layer_"+sub_layer);
    }
}